

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof_data.c
# Opt level: O3

void duckdb_je_prof_reset(tsd_t *tsd,size_t lg_sample)

{
  prof_tdata_t **pppVar1;
  byte *pbVar2;
  long *plVar3;
  ulong *puVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  ulong uVar7;
  prof_tdata_t *ppVar8;
  prof_tdata_t *ppVar9;
  undefined8 uVar10;
  int iVar11;
  rtree_ctx_t *prVar12;
  rtree_ctx_cache_elm_t *prVar13;
  uintptr_t uVar14;
  rtree_leaf_elm_t *prVar15;
  rtree_ctx_t *prVar16;
  ulong uVar17;
  prof_tdata_tree_t pVar18;
  void *pvVar19;
  prof_tdata_t *ppVar20;
  long lVar21;
  prof_tdata_t *ppVar22;
  malloc_mutex_t *tsd_00;
  ulong uVar23;
  uint uVar24;
  mutex_prof_data_t *data;
  rtree_ctx_t *rtree_ctx;
  rtree_ctx_t *rtree_ctx_00;
  bool bVar25;
  rtree_ctx_t arStack_850 [5];
  malloc_mutex_t *pmStack_48;
  
  iVar11 = pthread_mutex_trylock((pthread_mutex_t *)((long)&duckdb_je_prof_dump_mtx.field_0 + 0x48))
  ;
  if (iVar11 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&duckdb_je_prof_dump_mtx);
    duckdb_je_prof_dump_mtx.field_0.field_0.locked.repr = (atomic_b_t)true;
  }
  duckdb_je_prof_dump_mtx.field_0.field_0.prof_data.n_lock_ops =
       duckdb_je_prof_dump_mtx.field_0.field_0.prof_data.n_lock_ops + 1;
  if (&(duckdb_je_prof_dump_mtx.field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
    duckdb_je_prof_dump_mtx.field_0.witness.link.qre_prev =
         (witness_t *)(duckdb_je_prof_dump_mtx.field_0.field_0.prof_data.n_owner_switches + 1);
    duckdb_je_prof_dump_mtx.field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
  }
  pthread_mutex_trylock((pthread_mutex_t *)((long)&duckdb_je_tdatas_mtx.field_0 + 0x48));
  tsd_00 = &duckdb_je_tdatas_mtx;
  duckdb_je_malloc_mutex_lock_slow(&duckdb_je_tdatas_mtx);
  pmStack_48 = &duckdb_je_tdatas_mtx;
  prVar12 = arStack_850;
  rtree_ctx = arStack_850;
  rtree_ctx_00 = arStack_850;
  arStack_850[0].cache[0].leafkey = (uintptr_t)tdatas.rbt_root;
  if (tdatas.rbt_root != (prof_tdata_t *)0x0) {
    uVar17 = *(ulong *)(lg_sample + 8);
    pVar18 = tdatas;
    prVar16 = arStack_850;
    do {
      prVar12 = (rtree_ctx_t *)(prVar16->cache + 1);
      uVar23 = (pVar18.rbt_root)->thr_uid;
      iVar11 = (uint)(uVar17 >= uVar23 && uVar17 != uVar23) - (uint)(uVar17 < uVar23);
      if (iVar11 == 0) {
        uVar23 = *(ulong *)(lg_sample + 0x10);
        uVar7 = (pVar18.rbt_root)->thr_discrim;
        iVar11 = (uint)(uVar23 >= uVar7 && uVar23 != uVar7) - (uint)(uVar23 < uVar7);
      }
      *(int *)&prVar16->cache[0].leaf = iVar11;
      if (-1 < iVar11) {
        pVar18.rbt_root = ((pVar18.rbt_root)->tdata_link).rbn_right_red & 0xfffffffffffffffe;
        prVar12->cache[0].leafkey = (uintptr_t)pVar18.rbt_root;
        if (iVar11 != 0) goto LAB_01c57725;
        *(undefined4 *)&prVar16->cache[0].leaf = 1;
        while (pVar18.rbt_root != (prof_tdata_t *)0x0) {
          *(undefined4 *)&prVar12->cache[0].leaf = 0xffffffff;
          pVar18.rbt_root = ((pVar18.rbt_root)->tdata_link).rbn_left;
          prVar12->cache[1].leafkey = (uintptr_t)pVar18.rbt_root;
          prVar12 = (rtree_ctx_t *)(prVar12->cache + 1);
        }
        goto LAB_01c57739;
      }
      pVar18.rbt_root = ((pVar18.rbt_root)->tdata_link).rbn_left;
      prVar12->cache[0].leafkey = (uintptr_t)pVar18.rbt_root;
LAB_01c57725:
      prVar16 = prVar12;
    } while (pVar18.rbt_root != (prof_tdata_t *)0x0);
  }
  prVar16 = (rtree_ctx_t *)0x0;
LAB_01c57739:
  prVar13 = prVar12[-1].l2_cache + 7;
  pvVar19 = (void *)prVar12[-1].l2_cache[7].leafkey;
  if (pvVar19 == (void *)lg_sample) {
    pVar18.rbt_root = *(prof_tdata_t **)(lg_sample + 0x18);
    if (pVar18.rbt_root != (prof_tdata_t *)0x0) {
      pppVar1 = &((pVar18.rbt_root)->tdata_link).rbn_right_red;
      *(byte *)pppVar1 = *(byte *)pppVar1 & 0xfe;
      if ((rtree_ctx_t *)prVar13 != arStack_850) {
        if (*(int *)&prVar12[-1].l2_cache[6].leaf < 0) {
          uVar14 = prVar12[-1].l2_cache[6].leafkey;
LAB_01c57ae1:
          *(prof_tdata_t **)(uVar14 + 0x18) = pVar18.rbt_root;
          pVar18 = tdatas;
        }
        else {
          uVar14 = prVar12[-1].l2_cache[6].leafkey;
LAB_01c57ace:
          *(ulong *)(uVar14 + 0x20) =
               (ulong)((uint)*(undefined8 *)(uVar14 + 0x20) & 1) | (ulong)pVar18.rbt_root;
          pVar18 = tdatas;
        }
      }
      goto LAB_01c57b57;
    }
    if ((rtree_ctx_t *)prVar13 == arStack_850) {
      tdatas.rbt_root = (prof_tdata_t *)0x0;
      pVar18.rbt_root = tdatas.rbt_root;
      goto LAB_01c57b57;
    }
  }
  else {
    uVar17 = *(ulong *)((long)pvVar19 + 0x20);
    uVar23 = (ulong)((uint)*(undefined8 *)(lg_sample + 0x20) & 1);
    *(ulong *)((long)pvVar19 + 0x20) = uVar17 & 0xfffffffffffffffe | uVar23;
    *(undefined8 *)((long)pvVar19 + 0x18) = *(undefined8 *)(lg_sample + 0x18);
    *(ulong *)((long)pvVar19 + 0x20) = *(ulong *)(lg_sample + 0x20) & 0xfffffffffffffffe | uVar23;
    *(ulong *)(lg_sample + 0x20) =
         *(ulong *)(lg_sample + 0x20) & 0xfffffffffffffffe | (ulong)((uint)uVar17 & 1);
    prVar16->cache[0].leafkey = (uintptr_t)pvVar19;
    prVar13->leafkey = lg_sample;
    pvVar19 = (void *)lg_sample;
    if (prVar16 == arStack_850) {
      tdatas.rbt_root = (prof_tdata_t *)prVar16->cache[0].leafkey;
    }
    else {
      uVar17 = prVar16->cache[0].leafkey;
      if (*(int *)&prVar16[-1].l2_cache[7].leaf < 0) {
        *(ulong *)(prVar16[-1].l2_cache[7].leafkey + 0x18) = uVar17;
      }
      else {
        uVar14 = prVar16[-1].l2_cache[7].leafkey;
        *(ulong *)(uVar14 + 0x20) = (uint)*(undefined8 *)(uVar14 + 0x20) & 1 | uVar17;
      }
    }
  }
  if ((*(byte *)((long)pvVar19 + 0x20) & 1) == 0) {
    prVar12[-1].l2_cache[7].leafkey = 0;
    if (arStack_850 <= prVar12[-1].l2_cache + 6) {
      prVar13 = prVar12[-1].l2_cache + 5;
      do {
        ppVar22 = (prof_tdata_t *)prVar13[2].leafkey;
        if (-1 < *(int *)&prVar13[1].leaf) {
          uVar17 = prVar13[1].leafkey;
          ppVar8 = *(prof_tdata_t **)(uVar17 + 0x18);
          uVar23 = (ulong)((uint)*(undefined8 *)(uVar17 + 0x20) & 1);
          *(ulong *)(uVar17 + 0x20) = uVar23 | (ulong)ppVar22;
          ppVar20 = (ppVar8->tdata_link).rbn_right_red;
          pVar18.rbt_root = ppVar8;
          if (((ulong)ppVar20 & 1) == 0) {
            if (uVar23 == 0 && ((ulong)ppVar22 & 1) == 0) {
              ppVar22 = (ppVar8->tdata_link).rbn_left;
              if ((ppVar22 == (prof_tdata_t *)0x0) ||
                 (ppVar9 = (ppVar22->tdata_link).rbn_right_red, ((ulong)ppVar9 & 1) == 0)) {
                (ppVar8->tdata_link).rbn_right_red = (prof_tdata_t *)((ulong)ppVar20 | 1);
                goto LAB_01c578e2;
              }
              (ppVar22->tdata_link).rbn_right_red =
                   (prof_tdata_t *)((ulong)ppVar9 & 0xfffffffffffffffe);
              ppVar22 = (ppVar8->tdata_link).rbn_right_red;
              *(ulong *)(uVar17 + 0x18) = (ulong)ppVar22 & 0xfffffffffffffffe;
              (ppVar8->tdata_link).rbn_right_red = (prof_tdata_t *)((uint)ppVar22 & 1 | uVar17);
              if ((rtree_ctx_t *)(prVar13 + 1) == arStack_850) goto LAB_01c57b57;
            }
            else {
              ppVar9 = (ppVar8->tdata_link).rbn_left;
              if ((ppVar9 == (prof_tdata_t *)0x0) ||
                 (((ulong)(ppVar9->tdata_link).rbn_right_red & 1) == 0)) {
                (ppVar8->tdata_link).rbn_right_red = (prof_tdata_t *)((ulong)ppVar20 | 1);
                *(byte *)(uVar17 + 0x20) = *(byte *)(uVar17 + 0x20) & 0xfe;
                pVar18 = tdatas;
                goto LAB_01c57b57;
              }
              *(ulong *)(uVar17 + 0x20) = (ulong)ppVar22 & 0xfffffffffffffffe;
              pppVar1 = &(ppVar8->tdata_link).rbn_right_red;
              *(byte *)pppVar1 = *(byte *)pppVar1 | 1;
              pppVar1 = &(ppVar9->tdata_link).rbn_right_red;
              *(byte *)pppVar1 = *(byte *)pppVar1 & 0xfe;
              ppVar22 = (ppVar8->tdata_link).rbn_right_red;
              *(ulong *)(uVar17 + 0x18) = (ulong)ppVar22 & 0xfffffffffffffffe;
              (ppVar8->tdata_link).rbn_right_red = (prof_tdata_t *)((uint)ppVar22 & 1 | uVar17);
            }
          }
          else {
            lVar21 = *(long *)(((ulong)ppVar20 & 0xfffffffffffffffe) + 0x18);
            if ((lVar21 == 0) || ((*(ulong *)(lVar21 + 0x20) & 1) == 0)) {
              pbVar2 = (byte *)(((ulong)ppVar20 & 0xfffffffffffffffe) + 0x20);
              *pbVar2 = *pbVar2 | 1;
              *(ulong *)(uVar17 + 0x18) =
                   (ulong)(ppVar8->tdata_link).rbn_right_red & 0xfffffffffffffffe;
              (ppVar8->tdata_link).rbn_right_red = (prof_tdata_t *)(uVar17 & 0xfffffffffffffffe);
            }
            else {
              *(ulong *)(lVar21 + 0x20) = *(ulong *)(lVar21 + 0x20) & 0xfffffffffffffffe;
              ppVar22 = (ppVar8->tdata_link).rbn_right_red;
              pVar18.rbt_root = ppVar22 & 0xfffffffffffffffe;
              (ppVar8->tdata_link).rbn_right_red = (prof_tdata_t *)((uint)ppVar22 & 1 | uVar17);
              ppVar22 = ((pVar18.rbt_root)->tdata_link).rbn_right_red;
              *(ulong *)(uVar17 + 0x18) = (ulong)ppVar22 & 0xfffffffffffffffe;
              ((pVar18.rbt_root)->tdata_link).rbn_right_red =
                   (prof_tdata_t *)((uint)ppVar22 & 1 | uVar17);
              (ppVar8->tdata_link).rbn_right_red =
                   (prof_tdata_t *)
                   ((ulong)((uint)(ppVar8->tdata_link).rbn_right_red & 1) |
                   (ulong)((pVar18.rbt_root)->tdata_link).rbn_left);
              ((pVar18.rbt_root)->tdata_link).rbn_left = ppVar8;
            }
            if ((rtree_ctx_t *)(prVar13 + 1) == arStack_850) goto LAB_01c57b57;
          }
          if (*(int *)&prVar13->leaf < 0) {
            uVar14 = prVar13->leafkey;
            goto LAB_01c57ae1;
          }
          uVar14 = prVar13->leafkey;
          goto LAB_01c57ace;
        }
        ppVar8 = (prof_tdata_t *)prVar13[1].leafkey;
        (ppVar8->tdata_link).rbn_left = ppVar22;
        ppVar22 = (ppVar8->tdata_link).rbn_right_red;
        if (((ulong)ppVar22 & 1) != 0) {
          ppVar22 = (prof_tdata_t *)((ulong)ppVar22 & 0xfffffffffffffffe);
          ppVar20 = (ppVar22->tdata_link).rbn_left;
          if ((ppVar20 == (prof_tdata_t *)0x0) ||
             (((ulong)(ppVar20->tdata_link).rbn_right_red & 1) == 0)) {
            ppVar20 = (prof_tdata_t *)((ulong)ppVar20 | 1);
          }
          else {
            (ppVar8->tdata_link).rbn_right_red = ppVar22;
            ppVar9 = (ppVar20->tdata_link).rbn_right_red;
            (ppVar22->tdata_link).rbn_left = (prof_tdata_t *)((ulong)ppVar9 & 0xfffffffffffffffe);
            (ppVar20->tdata_link).rbn_right_red =
                 (prof_tdata_t *)((ulong)((uint)ppVar9 & 1) | (ulong)ppVar22);
            ppVar22 = (prof_tdata_t *)((ulong)ppVar20 & 0xfffffffffffffffe);
            ppVar20 = (prof_tdata_t *)
                      ((ulong)((*(uint *)&(ppVar8->tdata_link).rbn_right_red | (uint)ppVar20) & 1) |
                      (ulong)(ppVar22->tdata_link).rbn_left);
          }
          (ppVar8->tdata_link).rbn_right_red = ppVar20;
          (ppVar22->tdata_link).rbn_left = ppVar8;
          if (*(int *)&prVar13->leaf < 0) {
            *(prof_tdata_t **)(prVar13->leafkey + 0x18) = ppVar22;
            pVar18 = tdatas;
          }
          else {
            uVar14 = prVar13->leafkey;
            uVar17 = (ulong)((uint)*(undefined8 *)(uVar14 + 0x20) & 1) | (ulong)ppVar22;
LAB_01c57b3b:
            *(ulong *)(uVar14 + 0x20) = uVar17;
            pVar18 = tdatas;
          }
          goto LAB_01c57b57;
        }
        ppVar20 = (ppVar22->tdata_link).rbn_left;
        if ((ppVar20 != (prof_tdata_t *)0x0) &&
           (ppVar9 = (ppVar20->tdata_link).rbn_right_red, ((ulong)ppVar9 & 1) != 0)) {
          (ppVar22->tdata_link).rbn_left = (prof_tdata_t *)((ulong)ppVar9 & 0xfffffffffffffffe);
          (ppVar20->tdata_link).rbn_right_red = ppVar22;
          pVar18.rbt_root = ppVar20 & 0xfffffffffffffffe;
          (ppVar8->tdata_link).rbn_right_red =
               (prof_tdata_t *)
               ((ulong)((*(uint *)&(ppVar8->tdata_link).rbn_right_red | (uint)ppVar20) & 1) |
               (ulong)((pVar18.rbt_root)->tdata_link).rbn_left);
          ((pVar18.rbt_root)->tdata_link).rbn_left = ppVar8;
          if ((rtree_ctx_t *)(prVar13 + 1) != arStack_850) {
            uVar14 = prVar13->leafkey;
            if (-1 < *(int *)&prVar13->leaf) {
              uVar17 = (ulong)((uint)*(undefined8 *)(uVar14 + 0x20) & 1) | (ulong)pVar18.rbt_root;
              goto LAB_01c57b3b;
            }
            *(prof_tdata_t **)(uVar14 + 0x18) = pVar18.rbt_root;
            pVar18 = tdatas;
          }
          goto LAB_01c57b57;
        }
        (ppVar8->tdata_link).rbn_right_red = (prof_tdata_t *)((ulong)ppVar20 | 1);
        (ppVar22->tdata_link).rbn_left = ppVar8;
        prVar13[1].leafkey = (uintptr_t)ppVar22;
LAB_01c578e2:
        bVar25 = arStack_850 <= prVar13;
        prVar13 = prVar13 + -1;
      } while (bVar25);
    }
    tdatas.rbt_root = (prof_tdata_t *)arStack_850[0].cache[0].leafkey;
    pVar18.rbt_root = tdatas.rbt_root;
  }
  else {
    *(undefined8 *)(prVar12[-1].l2_cache[6].leafkey + 0x18) = 0;
    pVar18 = tdatas;
  }
LAB_01c57b57:
  tdatas.rbt_root = pVar18.rbt_root;
  duckdb_je_ckh_delete((tsd_t *)tsd_00,(ckh_t *)(lg_sample + 0x30));
  if ((tsd_t *)tsd_00 == (tsd_t *)0x0) {
    duckdb_je_rtree_ctx_data_init(arStack_850);
  }
  else {
    rtree_ctx = &((tsd_t *)tsd_00)->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  uVar24 = (uint)(lg_sample >> 0x1e) & 0xf;
  uVar23 = lg_sample & 0xffffffffc0000000;
  uVar17 = (ulong)(uVar24 << 4);
  puVar4 = (ulong *)((long)&rtree_ctx->cache[0].leafkey + uVar17);
  uVar17 = *(ulong *)((long)&rtree_ctx->cache[0].leafkey + uVar17);
  if (uVar17 == uVar23) {
    prVar15 = (rtree_leaf_elm_t *)((ulong)((uint)(lg_sample >> 9) & 0x1ffff8) + puVar4[1]);
  }
  else if (rtree_ctx->l2_cache[0].leafkey == uVar23) {
    prVar15 = rtree_ctx->l2_cache[0].leaf;
    rtree_ctx->l2_cache[0].leafkey = uVar17;
    rtree_ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar4[1];
    *puVar4 = uVar23;
    puVar4[1] = (ulong)prVar15;
    prVar15 = (rtree_leaf_elm_t *)
              ((long)&(prVar15->le_bits).repr + (ulong)((uint)(lg_sample >> 9) & 0x1ffff8));
  }
  else {
    lVar21 = 0x118;
    do {
      if (*(ulong *)((long)rtree_ctx->cache + lVar21 + -8) == uVar23) {
        uVar7 = *(ulong *)((long)&rtree_ctx->cache[0].leafkey + lVar21);
        puVar5 = (undefined8 *)((long)rtree_ctx->cache + lVar21 + -0x18);
        uVar10 = puVar5[1];
        puVar6 = (undefined8 *)((long)rtree_ctx->cache + lVar21 + -8);
        *puVar6 = *puVar5;
        puVar6[1] = uVar10;
        *(ulong *)((long)rtree_ctx->cache + lVar21 + -0x18) = uVar17;
        *(ulong *)((long)(rtree_ctx->cache + -1) + lVar21) = puVar4[1];
        *puVar4 = uVar23;
        puVar4[1] = uVar7;
        prVar15 = (rtree_leaf_elm_t *)(((uint)(lg_sample >> 9) & 0x1ffff8) + uVar7);
        goto LAB_01c57bb6;
      }
      lVar21 = lVar21 + 0x10;
    } while (lVar21 != 0x188);
    prVar15 = duckdb_je_rtree_leaf_elm_lookup_hard
                        ((tsdn_t *)tsd_00,&duckdb_je_arena_emap_global.rtree,rtree_ctx,lg_sample,
                         true,false);
  }
LAB_01c57bb6:
  pvVar19 = duckdb_je_arenas
            [*(uint *)(((long)(prVar15->le_bits).repr << 0x10) >> 0x10 & 0xffffffffffffff80) & 0xfff
            ].repr;
  if ((tsd_t *)tsd_00 == (tsd_t *)0x0) {
    duckdb_je_rtree_ctx_data_init(arStack_850);
  }
  else {
    rtree_ctx_00 = &((tsd_t *)tsd_00)->
                    cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  uVar17 = (ulong)(uVar24 << 4);
  puVar4 = (ulong *)((long)&rtree_ctx_00->cache[0].leafkey + uVar17);
  uVar17 = *(ulong *)((long)&rtree_ctx_00->cache[0].leafkey + uVar17);
  if (uVar17 == uVar23) {
    prVar15 = (rtree_leaf_elm_t *)((ulong)((uint)(lg_sample >> 9) & 0x1ffff8) + puVar4[1]);
  }
  else if (rtree_ctx_00->l2_cache[0].leafkey == uVar23) {
    prVar15 = rtree_ctx_00->l2_cache[0].leaf;
    rtree_ctx_00->l2_cache[0].leafkey = uVar17;
    rtree_ctx_00->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar4[1];
    *puVar4 = uVar23;
    puVar4[1] = (ulong)prVar15;
    prVar15 = (rtree_leaf_elm_t *)
              ((long)&(prVar15->le_bits).repr + (ulong)((uint)(lg_sample >> 9) & 0x1ffff8));
  }
  else {
    lVar21 = 0x118;
    do {
      if (*(ulong *)((long)rtree_ctx_00->cache + lVar21 + -8) == uVar23) {
        uVar7 = *(ulong *)((long)&rtree_ctx_00->cache[0].leafkey + lVar21);
        puVar5 = (undefined8 *)((long)rtree_ctx_00->cache + lVar21 + -0x18);
        uVar10 = puVar5[1];
        puVar6 = (undefined8 *)((long)rtree_ctx_00->cache + lVar21 + -8);
        *puVar6 = *puVar5;
        puVar6[1] = uVar10;
        *(ulong *)((long)rtree_ctx_00->cache + lVar21 + -0x18) = uVar17;
        *(ulong *)((long)(rtree_ctx_00->cache + -1) + lVar21) = puVar4[1];
        *puVar4 = uVar23;
        puVar4[1] = uVar7;
        prVar15 = (rtree_leaf_elm_t *)(((uint)(lg_sample >> 9) & 0x1ffff8) + uVar7);
        goto LAB_01c57c0a;
      }
      lVar21 = lVar21 + 0x10;
    } while (lVar21 != 0x188);
    prVar15 = duckdb_je_rtree_leaf_elm_lookup_hard
                        ((tsdn_t *)tsd_00,&duckdb_je_arena_emap_global.rtree,rtree_ctx_00,lg_sample,
                         true,false);
  }
LAB_01c57c0a:
  LOCK();
  plVar3 = (long *)((long)pvVar19 + 0x48);
  *plVar3 = *plVar3 - duckdb_je_sz_index2size_tab[(ulong)(prVar15->le_bits).repr >> 0x30];
  UNLOCK();
  arena_dalloc_no_tcache((tsdn_t *)tsd_00,(void *)lg_sample);
  return;
}

Assistant:

void
prof_reset(tsd_t *tsd, size_t lg_sample) {
	prof_tdata_t *next;

	assert(lg_sample < (sizeof(uint64_t) << 3));

	malloc_mutex_lock(tsd_tsdn(tsd), &prof_dump_mtx);
	malloc_mutex_lock(tsd_tsdn(tsd), &tdatas_mtx);

	lg_prof_sample = lg_sample;
	prof_unbias_map_init();

	next = NULL;
	do {
		prof_tdata_t *to_destroy = tdata_tree_iter(&tdatas, next,
		    prof_tdata_reset_iter, (void *)tsd);
		if (to_destroy != NULL) {
			next = tdata_tree_next(&tdatas, to_destroy);
			prof_tdata_destroy_locked(tsd, to_destroy, false);
		} else {
			next = NULL;
		}
	} while (next != NULL);

	malloc_mutex_unlock(tsd_tsdn(tsd), &tdatas_mtx);
	malloc_mutex_unlock(tsd_tsdn(tsd), &prof_dump_mtx);
}